

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffpunt(fitsfile *fptr,char *keyname,char *unit,int *status)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *comm;
  char newcomm [73];
  char oldcomm [73];
  char value [71];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  comm = oldcomm;
  iVar2 = ffgkey(fptr,keyname,value,comm,status);
  if (iVar2 < 1) {
    if (*unit == '\0') {
      newcomm._0_2_ = (ushort)(byte)newcomm[1] << 8;
      sVar3 = 0x48;
    }
    else {
      newcomm[0] = '[';
      newcomm[1] = '\0';
      strncat(newcomm,unit,0x2d);
      sVar3 = strlen(newcomm);
      (newcomm + sVar3)[0] = ']';
      (newcomm + sVar3)[1] = ' ';
      newcomm[sVar3 + 2] = '\0';
      sVar3 = strlen(newcomm);
      sVar3 = 0x48 - sVar3;
    }
    if (oldcomm[0] == '[') {
      comm = oldcomm;
      pcVar4 = strchr(comm,0x5d);
      if (pcVar4 != (char *)0x0) {
        do {
          comm = pcVar4 + 1;
          pcVar1 = pcVar4 + 1;
          pcVar4 = comm;
        } while (*pcVar1 == ' ');
      }
    }
    strncat(newcomm,comm,sVar3);
    ffmkky(keyname,value,newcomm,card,status);
    ffmkey(fptr,card,status);
  }
  return *status;
}

Assistant:

int ffpunt(fitsfile *fptr,     /* I - FITS file pointer   */
           const char *keyname,/* I - keyword name        */
           const char *unit,   /* I - keyword unit string */
           int *status)        /* IO - error status       */
/*
    Write (put) the units string into the comment field of the existing keyword.
    This routine uses a  FITS convention  in which the units are enclosed in 
    square brackets following the '/' comment field delimiter, e.g.:

    KEYWORD =                   12 / [kpc] comment string goes here
*/
{
    char oldcomm[FLEN_COMMENT];
    char newcomm[FLEN_COMMENT];
    char value[FLEN_VALUE];
    char card[FLEN_CARD];
    char *loc;
    size_t len;
 
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, value, oldcomm, status) > 0)
        return(*status);

    /* copy the units string to the new comment string if not null */
    if (*unit)
    {
        strcpy(newcomm, "[");
        strncat(newcomm, unit, 45);  /* max allowed length is about 45 chars */
        strcat(newcomm, "] ");
        len = strlen(newcomm);  
        len = FLEN_COMMENT - len - 1;  /* amount of space left in the field */
    }
    else
    {
        newcomm[0] = '\0';
        len = FLEN_COMMENT - 1;
    }

    if (oldcomm[0] == '[')  /* check for existing units field */
    {
        loc = strchr(oldcomm, ']');  /* look for the closing bracket */
        if (loc)
        {
            loc++;
            while (*loc == ' ')   /* skip any blank spaces */
               loc++;

            strncat(newcomm, loc, len);  /* concat remainder of comment */
        }
        else
        {
            strncat(newcomm, oldcomm, len);  /* append old comment onto new */
        }
    }
    else
    {
        strncat(newcomm, oldcomm, len);
    }

    ffmkky(keyname, value, newcomm, card, status);  /* construct the card */
    ffmkey(fptr, card, status);  /* rewrite with new units string */

    return(*status);
}